

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gguf.cpp
# Opt level: O3

vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
* get_tensor_configs(vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                     *__return_storage_ptr__,mt19937 *rng)

{
  pointer *pppVar1;
  iterator __position;
  result_type rVar2;
  vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  *pvVar3;
  long lVar4;
  result_type rVar5;
  vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  *extraout_RAX;
  ulong uVar6;
  int i;
  int iVar7;
  ggml_type gVar8;
  array<long,_4UL> shape;
  long alStack_70 [2];
  vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  *pvStack_60;
  pair<ggml_type,_std::array<long,_4UL>_> local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  ::reserve(__return_storage_ptr__,100);
  iVar7 = 0;
  do {
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rng);
    gVar8 = (int)rVar2 + (int)(rVar2 / 0x27) * -0x27;
    pvVar3 = (vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
              *)ggml_type_size(gVar8);
    if (pvVar3 != (vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                   *)0x0) {
      alStack_70[1] = 1;
      pvStack_60 = (vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                    *)0x1;
      alStack_70[0] = 1;
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(rng);
      lVar4 = ggml_blck_size(gVar8);
      lVar4 = lVar4 * ((rVar2 / 5 & 0xfffffffffffffffe) * -5 + rVar2 + 1);
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(rng);
      if ((rVar2 & 3) != 0) {
        uVar6 = 0;
        do {
          rVar5 = std::
                  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                  ::operator()(rng);
          alStack_70[uVar6] = (rVar5 / 5 & 0xfffffffffffffffe) * -5 + rVar5 + 1;
          uVar6 = uVar6 + 1;
        } while (((uint)rVar2 & 3) != uVar6);
      }
      local_58.second._M_elems[2] = alStack_70[1];
      local_58.second._M_elems[3] = (long)pvStack_60;
      local_58.second._M_elems[1] = alStack_70[0];
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      local_58.first = gVar8;
      local_58.second._M_elems[0] = lVar4;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::pair<ggml_type,std::array<long,4ul>>,std::allocator<std::pair<ggml_type,std::array<long,4ul>>>>
        ::_M_realloc_insert<std::pair<ggml_type,std::array<long,4ul>>>
                  ((vector<std::pair<ggml_type,std::array<long,4ul>>,std::allocator<std::pair<ggml_type,std::array<long,4ul>>>>
                    *)__return_storage_ptr__,__position,&local_58);
        pvVar3 = extraout_RAX;
      }
      else {
        ((__position._M_current)->second)._M_elems[3] = (long)pvStack_60;
        ((__position._M_current)->second)._M_elems[1] = alStack_70[0];
        ((__position._M_current)->second)._M_elems[2] = alStack_70[1];
        *(ulong *)__position._M_current = CONCAT44(local_58._4_4_,gVar8);
        ((__position._M_current)->second)._M_elems[0] = lVar4;
        pppVar1 = &(__return_storage_ptr__->
                   super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
        pvVar3 = pvStack_60;
      }
    }
    iVar7 = iVar7 + 1;
  } while (iVar7 != 100);
  return pvVar3;
}

Assistant:

static std::vector<tensor_config_t> get_tensor_configs(std::mt19937 & rng) {
    std::vector<tensor_config_t> tensor_configs;
    tensor_configs.reserve(100);

    for (int i = 0; i < 100; ++i) {
        const enum ggml_type type = ggml_type(rng() % GGML_TYPE_COUNT);
        if (ggml_type_size(type) == 0) {
            continue;
        }

        std::array<int64_t, GGML_MAX_DIMS> shape = {1, 1, 1, 1};
        shape[0] = (1 + rng() % 10) * ggml_blck_size(type);
        const int n_dims = 1 + rng() % GGML_MAX_DIMS;
        for (int i = 1; i < n_dims; ++i) {
            shape[i] = 1 + rng() % 10;
        }

        tensor_configs.push_back(std::make_pair(type, shape));
    }

    return tensor_configs;
}